

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::OpenOutputFile
          (cmCTest *this,string *path,string *name,cmGeneratedFileStream *stream,
          bool cm_zlib_compress)

{
  bool bVar1;
  ostream *poVar2;
  string filename;
  string testingDir;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  
  std::operator+(&testingDir,&this->BinaryDir,"/Testing");
  if (path->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"/",path);
    std::__cxx11::string::append((string *)&testingDir);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  bVar1 = cmsys::SystemTools::FileExists(testingDir._M_dataplus._M_p);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory(&testingDir);
    if (bVar1) {
LAB_002dd1b7:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&testingDir,"/");
      std::operator+(&filename,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,name);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      cmGeneratedFileStream::Open(stream,filename._M_dataplus._M_p,false,false);
      bVar1 = ((&(stream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 field_0x20)
               [(long)(stream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]] & 5) == 0;
      if (bVar1) {
        if ((cm_zlib_compress) && (this->CompressXMLFiles == true)) {
          cmGeneratedFileStream::SetCompression(stream,true);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem opening file: ");
        poVar2 = std::operator<<(poVar2,(string *)&filename);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x304,local_1c0[0],false);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      std::__cxx11::string::~string((string *)&filename);
      goto LAB_002dd322;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"File ");
    poVar2 = std::operator<<(poVar2,(string *)&testingDir);
    poVar2 = std::operator<<(poVar2," is in the place of the testing directory");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x2f6,filename._M_dataplus._M_p,false);
  }
  else {
    bVar1 = cmsys::SystemTools::MakeDirectory(testingDir._M_dataplus._M_p);
    if (bVar1) goto LAB_002dd1b7;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot create directory ");
    poVar2 = std::operator<<(poVar2,(string *)&testingDir);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x2fc,filename._M_dataplus._M_p,false);
  }
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar1 = false;
LAB_002dd322:
  std::__cxx11::string::~string((string *)&testingDir);
  return bVar1;
}

Assistant:

bool cmCTest::OpenOutputFile(const std::string& path, const std::string& name,
                             cmGeneratedFileStream& stream, bool compress)
{
  std::string testingDir = this->BinaryDir + "/Testing";
  if (!path.empty()) {
    testingDir += "/" + path;
  }
  if (cmSystemTools::FileExists(testingDir.c_str())) {
    if (!cmSystemTools::FileIsDirectory(testingDir)) {
      cmCTestLog(this, ERROR_MESSAGE, "File "
                   << testingDir << " is in the place of the testing directory"
                   << std::endl);
      return false;
    }
  } else {
    if (!cmSystemTools::MakeDirectory(testingDir.c_str())) {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory " << testingDir
                                                                 << std::endl);
      return false;
    }
  }
  std::string filename = testingDir + "/" + name;
  stream.Open(filename.c_str());
  if (!stream) {
    cmCTestLog(this, ERROR_MESSAGE, "Problem opening file: " << filename
                                                             << std::endl);
    return false;
  }
  if (compress) {
    if (this->CompressXMLFiles) {
      stream.SetCompression(true);
    }
  }
  return true;
}